

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cifra.c
# Opt level: O0

int aead_chacha20poly1305_setup_crypto(ptls_aead_context_t *_ctx,int is_enc,void *key)

{
  chacha20poly1305_context_t *ctx;
  void *key_local;
  int is_enc_local;
  ptls_aead_context_t *_ctx_local;
  
  _ctx->dispose_crypto = chacha20poly1305_dispose_crypto;
  if (is_enc == 0) {
    _ctx->do_encrypt_init = (_func_void_st_ptls_aead_context_t_ptr_void_ptr_void_ptr_size_t *)0x0;
    _ctx->do_encrypt_update =
         (_func_size_t_st_ptls_aead_context_t_ptr_void_ptr_void_ptr_size_t *)0x0;
    _ctx->do_encrypt_final = (_func_size_t_st_ptls_aead_context_t_ptr_void_ptr *)0x0;
    _ctx->do_decrypt = chacha20poly1305_decrypt;
  }
  else {
    _ctx->do_encrypt_init = chacha20poly1305_init;
    _ctx->do_encrypt_update = chacha20poly1305_encrypt_update;
    _ctx->do_encrypt_final = chacha20poly1305_encrypt_final;
    _ctx->do_decrypt =
         (_func_size_t_st_ptls_aead_context_t_ptr_void_ptr_void_ptr_size_t_void_ptr_void_ptr_size_t
          *)0x0;
  }
  _ctx[1].algo = *key;
  *(undefined8 *)_ctx[1].static_iv = *(undefined8 *)((long)key + 8);
  *(undefined8 *)(_ctx[1].static_iv + 8) = *(undefined8 *)((long)key + 0x10);
  _ctx[1].dispose_crypto = *(_func_void_st_ptls_aead_context_t_ptr **)((long)key + 0x18);
  return 0;
}

Assistant:

static int aead_chacha20poly1305_setup_crypto(ptls_aead_context_t *_ctx, int is_enc, const void *key)
{
    struct chacha20poly1305_context_t *ctx = (struct chacha20poly1305_context_t *)_ctx;

    ctx->super.dispose_crypto = chacha20poly1305_dispose_crypto;
    if (is_enc) {
        ctx->super.do_encrypt_init = chacha20poly1305_init;
        ctx->super.do_encrypt_update = chacha20poly1305_encrypt_update;
        ctx->super.do_encrypt_final = chacha20poly1305_encrypt_final;
        ctx->super.do_decrypt = NULL;
    } else {
        ctx->super.do_encrypt_init = NULL;
        ctx->super.do_encrypt_update = NULL;
        ctx->super.do_encrypt_final = NULL;
        ctx->super.do_decrypt = chacha20poly1305_decrypt;
    }

    memcpy(ctx->key, key, sizeof(ctx->key));
    return 0;
}